

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

int __thiscall
OpenMD::SelectionEvaluator::select
          (SelectionEvaluator *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  int extraout_EAX;
  int in_stack_00000228;
  int in_stack_0000022c;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_00000230;
  SelectionEvaluator *in_stack_00000238;
  SelectionSet *in_stack_ffffffffffffffc8;
  SelectionSet *in_stack_ffffffffffffffd0;
  
  expression(in_stack_00000238,in_stack_00000230,in_stack_0000022c,in_stack_00000228);
  SelectionSet::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SelectionSet::~SelectionSet((SelectionSet *)0x31e50e);
  return extraout_EAX;
}

Assistant:

void SelectionEvaluator::select(SelectionSet& bs, int frame) {
    bs = expression(statement, 1, frame);
  }